

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1537.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  char *__s;
  size_t sVar4;
  void *__s1;
  char *__s_00;
  char *pcVar5;
  char *pcVar6;
  int outlen;
  uchar a [14];
  
  a[8] = 0xa2;
  a[9] = 0xb3;
  a[10] = 0xc4;
  a[0xb] = 0xd5;
  a[0xc] = 0xe6;
  a[0xd] = 0xf7;
  a[0] = '/';
  a[1] = ':';
  a[2] = ';';
  a[3] = '<';
  a[4] = '=';
  a[5] = '>';
  a[6] = '?';
  a[7] = 0x91;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    uVar3 = curl_easy_escape(0,a,0xe);
    curl_mprintf("%s\n",uVar3);
    curl_free(uVar3);
    __s = (char *)curl_escape(a,0xe);
    curl_mprintf("%s\n",__s);
    iVar1 = 0x7e;
    pcVar5 = (char *)0x0;
    if (__s != (char *)0x0) {
      sVar4 = strlen(__s);
      __s1 = (void *)curl_easy_unescape(0,__s,sVar4 & 0xffffffff,&outlen);
      curl_mprintf("outlen == %d\n",outlen);
      iVar2 = bcmp(__s1,a,(long)outlen);
      pcVar6 = "no";
      pcVar5 = "no";
      if (iVar2 == 0) {
        pcVar5 = "YES";
      }
      curl_mprintf("unescape == original? %s\n",pcVar5);
      curl_free(__s1);
      sVar4 = strlen(__s);
      __s_00 = (char *)curl_unescape(__s,sVar4 & 0xffffffff);
      pcVar5 = __s;
      if (__s_00 != (char *)0x0) {
        sVar4 = strlen(__s_00);
        outlen = (int)sVar4;
        curl_mprintf("[old] outlen == %d\n",sVar4 & 0xffffffff);
        iVar1 = bcmp(__s_00,a,(long)outlen);
        if (iVar1 == 0) {
          pcVar6 = "YES";
        }
        curl_mprintf("[old] unescape == original? %s\n",pcVar6);
        curl_free(__s_00);
        curl_free(__s);
        uVar3 = curl_easy_escape(0,a,0xffffffff);
        curl_mprintf("escape -1 length: %s\n",uVar3);
        outlen = 0x7e1;
        pcVar5 = (char *)curl_easy_unescape(0,"moahahaha",0xffffffff,&outlen);
        curl_mprintf("unescape -1 length: %s %d\n",pcVar5,outlen);
        iVar1 = 0;
      }
    }
    curl_free(pcVar5);
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    iVar1 = 0x7e;
  }
  return iVar1;
}

Assistant:

int test(char *URL)
{
  const unsigned char a[] = {0x2f, 0x3a, 0x3b, 0x3c, 0x3d, 0x3e, 0x3f,
                             0x91, 0xa2, 0xb3, 0xc4, 0xd5, 0xe6, 0xf7};
  CURLcode res = CURLE_OK;
  char *ptr = NULL;
  int asize;
  int outlen;
  char *raw;

  (void)URL; /* we don't use this */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  asize = (int)sizeof(a);
  ptr = curl_easy_escape(NULL, (char *)a, asize);
  printf("%s\n", ptr);
  curl_free(ptr);

  /* deprecated API */
  ptr = curl_escape((char *)a, asize);
  printf("%s\n", ptr);
  if(!ptr) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  raw = curl_easy_unescape(NULL, ptr, (int)strlen(ptr), &outlen);
  printf("outlen == %d\n", outlen);
  printf("unescape == original? %s\n",
         memcmp(raw, a, outlen) ? "no" : "YES");
  curl_free(raw);

  /* deprecated API */
  raw = curl_unescape(ptr, (int)strlen(ptr));
  if(!raw) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  outlen = (int)strlen(raw);
  printf("[old] outlen == %d\n", outlen);
  printf("[old] unescape == original? %s\n",
         memcmp(raw, a, outlen) ? "no" : "YES");
  curl_free(raw);
  curl_free(ptr);

  /* weird input length */
  ptr = curl_easy_escape(NULL, (char *)a, -1);
  printf("escape -1 length: %s\n", ptr);

  /* weird input length */
  outlen = 2017; /* just a value */
  ptr = curl_easy_unescape(NULL, (char *)"moahahaha", -1, &outlen);
  printf("unescape -1 length: %s %d\n", ptr, outlen);

test_cleanup:
  curl_free(ptr);
  curl_global_cleanup();

  return (int)res;
}